

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControlPrivate::gotoPreviousTableCell(QWidgetTextControlPrivate *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QTextCursor *in_RDI;
  long in_FS_OFFSET;
  int newRow;
  int newColumn;
  QTextTable *table;
  QTextTableCell cell;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QTextCursor local_30 [8];
  QTextTableCell local_28 [16];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QTextCursor::currentTable();
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QTextTable::cellAt((QTextCursor *)&local_18);
  iVar2 = QTextTableCell::column();
  iVar3 = QTextTableCell::row();
  if ((-1 < iVar2 + -1) || (QTextTable::columns(), -1 < iVar3 + -1)) {
    QTextTable::cellAt((int)local_28,iVar1);
    QTextTableCell::operator=((QTextTableCell *)&local_18,local_28);
    QTextTableCell::~QTextTableCell(local_28);
    QTextTableCell::firstCursorPosition();
    QTextCursor::operator=
              ((QTextCursor *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
    QTextCursor::~QTextCursor(local_30);
  }
  QTextTableCell::~QTextTableCell((QTextTableCell *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::gotoPreviousTableCell()
{
    QTextTable *table = cursor.currentTable();
    QTextTableCell cell = table->cellAt(cursor);

    int newColumn = cell.column() - 1;
    int newRow = cell.row();

    if (newColumn < 0) {
        newColumn = table->columns() - 1;
        --newRow;
        if (newRow < 0)
            return;
    }

    cell = table->cellAt(newRow, newColumn);
    cursor = cell.firstCursorPosition();
}